

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::render_scene(Application *this,string *saveFileLocation)

{
  bool bVar1;
  Application *in_RSI;
  PathTracer *in_stack_ffffffffffffff90;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  PathTracer *in_stack_ffffffffffffffd0;
  int local_1c;
  duration<long,std::ratio<1l,1000l>> local_18 [8];
  Application *this_00;
  
  this_00 = in_RSI;
  set_up_pathtracer(in_RSI);
  PathTracer::start_raytracing((PathTracer *)this_00);
  while( true ) {
    bVar1 = PathTracer::is_done(in_stack_ffffffffffffff90);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1c = 5;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_18,&local_1c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffffc0);
  }
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)in_RSI);
  PathTracer::save_image(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void Application::render_scene(std::string saveFileLocation) {

  set_up_pathtracer();
  pathtracer->start_raytracing();

  while(!pathtracer->is_done()) {
    std::this_thread::sleep_for(std::chrono::milliseconds(5));
  }

  pathtracer->save_image(saveFileLocation);
}